

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::HandleMissingTarget
          (cmExportBuildFileGenerator *this,string *link_libs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets,cmGeneratorTarget *depender,cmGeneratorTarget *dependee)

{
  string *psVar1;
  cmLocalGenerator *this_00;
  cmGlobalGenerator *gg_00;
  size_type sVar2;
  reference pvVar3;
  string local_f0;
  int local_cc;
  string local_c8;
  undefined1 local_a8 [8];
  string missingTarget;
  undefined1 local_80 [4];
  int targetOccurrences;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  namespaces;
  cmGlobalGenerator *gg;
  string name;
  cmGeneratorTarget *dependee_local;
  cmGeneratorTarget *depender_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  string *link_libs_local;
  cmExportBuildFileGenerator *this_local;
  
  name.field_2._8_8_ = dependee;
  if (((this->super_cmExportFileGenerator).AppendMode & 1U) == 0) {
    psVar1 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    std::__cxx11::string::string((string *)&gg,(string *)psVar1);
    this_00 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)name.field_2._8_8_);
    gg_00 = cmLocalGenerator::GetGlobalGenerator(this_00);
    FindNamespaces((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_80,this,gg_00,(string *)&gg);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_80);
    missingTarget.field_2._12_4_ = (undefined4)sVar2;
    if (missingTarget.field_2._12_4_ == 1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_80,0);
      std::__cxx11::string::string((string *)local_a8,(string *)pvVar3);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_c8,(cmGeneratorTarget *)name.field_2._8_8_)
      ;
      std::__cxx11::string::operator+=((string *)local_a8,(string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::operator+=((string *)link_libs,(string *)local_a8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(missingTargets,(value_type *)local_a8);
      local_cc = 1;
      std::__cxx11::string::~string((string *)local_a8);
    }
    else {
      ComplainAboutMissingTarget
                (this,depender,(cmGeneratorTarget *)name.field_2._8_8_,missingTarget.field_2._12_4_)
      ;
      local_cc = 0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
    std::__cxx11::string::~string((string *)&gg);
    if (local_cc != 0) {
      return;
    }
  }
  std::__cxx11::string::operator+=
            ((string *)link_libs,(string *)&(this->super_cmExportFileGenerator).Namespace);
  cmGeneratorTarget::GetExportName_abi_cxx11_(&local_f0,(cmGeneratorTarget *)name.field_2._8_8_);
  std::__cxx11::string::operator+=((string *)link_libs,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  return;
}

Assistant:

void cmExportBuildFileGenerator::HandleMissingTarget(
  std::string& link_libs, std::vector<std::string>& missingTargets,
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee)
{
  // The target is not in the export.
  if (!this->AppendMode) {
    const std::string name = dependee->GetName();
    cmGlobalGenerator* gg =
      dependee->GetLocalGenerator()->GetGlobalGenerator();
    std::vector<std::string> namespaces = this->FindNamespaces(gg, name);

    int targetOccurrences = static_cast<int>(namespaces.size());
    if (targetOccurrences == 1) {
      std::string missingTarget = namespaces[0];

      missingTarget += dependee->GetExportName();
      link_libs += missingTarget;
      missingTargets.push_back(std::move(missingTarget));
      return;
    }
    // We are not appending, so all exported targets should be
    // known here.  This is probably user-error.
    this->ComplainAboutMissingTarget(depender, dependee, targetOccurrences);
  }
  // Assume the target will be exported by another command.
  // Append it with the export namespace.
  link_libs += this->Namespace;
  link_libs += dependee->GetExportName();
}